

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

bool __thiscall FIX::Session::validLogonState(Session *this,MsgType *msgType)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  
  psVar2 = &(msgType->super_StringField).super_FieldBase.m_string;
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (((iVar1 != 0) || (bVar3 = true, (this->m_state).m_sentReset == false)) &&
     (bVar3 = true, (this->m_state).m_receivedReset == false)) {
    iVar1 = std::__cxx11::string::compare((char *)psVar2);
    if ((iVar1 != 0) || ((this->m_state).m_receivedLogon == true)) {
      iVar1 = std::__cxx11::string::compare((char *)psVar2);
      if ((iVar1 == 0) || ((this->m_state).m_receivedLogon == false)) {
        iVar1 = std::__cxx11::string::compare((char *)psVar2);
        if ((iVar1 != 0) || ((this->m_state).m_sentLogon == false)) {
          iVar1 = std::__cxx11::string::compare((char *)psVar2);
          if ((iVar1 == 0) || ((this->m_state).m_sentLogout == false)) {
            iVar1 = std::__cxx11::string::compare((char *)psVar2);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)psVar2);
              bVar3 = iVar1 == 0;
            }
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool Session::validLogonState(const MsgType &msgType) {
  if ((msgType == MsgType_Logon && m_state.sentReset()) || (m_state.receivedReset())) {
    return true;
  }
  if ((msgType == MsgType_Logon && !m_state.receivedLogon()) || (msgType != MsgType_Logon && m_state.receivedLogon())) {
    return true;
  }
  if (msgType == MsgType_Logout && m_state.sentLogon()) {
    return true;
  }
  if (msgType != MsgType_Logout && m_state.sentLogout()) {
    return true;
  }
  if (msgType == MsgType_SequenceReset) {
    return true;
  }
  if (msgType == MsgType_Reject) {
    return true;
  }

  return false;
}